

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O2

void Cut_CellSuppMin(Cut_Cell_t *pCell)

{
  char *pcVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  uint *pOut;
  uint nVars;
  uint uVar5;
  uint *pIn;
  uint iVar;
  ulong uVar6;
  
  iVar = *(uint *)&pCell->field_0x20 & 0xf;
  uVar5 = iVar;
  while (uVar5 = uVar5 - 1, 0 < (int)iVar) {
    iVar = iVar - 1;
    iVar3 = Extra_TruthVarInSupport(pCell->uTruth,*(uint *)&pCell->field_0x20 & 0xf,iVar);
    if (iVar3 == 0) {
      uVar6 = 0;
      puVar2 = Cut_CellSuppMin::uTemp;
      pIn = pCell->uTruth;
      while( true ) {
        pOut = puVar2;
        uVar4 = *(uint *)&pCell->field_0x20;
        nVars = uVar4 & 0xf;
        iVar3 = (int)uVar6 + uVar5;
        if ((int)(nVars - 1) <= iVar3) break;
        Extra_TruthSwapAdjacentVars(pOut,pIn,nVars,iVar3);
        pcVar1 = pCell->CanonPerm + uVar6 + uVar5;
        *(ushort *)pcVar1 = *(ushort *)pcVar1 << 8 | *(ushort *)pcVar1 >> 8;
        uVar6 = uVar6 + 1;
        puVar2 = pIn;
        pIn = pOut;
      }
      if ((uVar6 & 1) != 0) {
        Extra_TruthCopy(pOut,pIn,nVars);
        uVar4 = *(uint *)&pCell->field_0x20;
      }
      *(uint *)&pCell->field_0x20 = uVar4 & 0xfffffff0 | uVar4 - 1 & 0xf;
    }
  }
  return;
}

Assistant:

void Cut_CellSuppMin( Cut_Cell_t * pCell )
{
    static unsigned uTemp[1<<(CUT_CELL_MVAR-5)];
    unsigned * pIn, * pOut, * pTemp;
    int i, k, Counter, Temp;

    // go backward through the support variables and remove redundant
    for ( k = pCell->nVars - 1; k >= 0; k-- )
        if ( !Extra_TruthVarInSupport(pCell->uTruth, pCell->nVars, k) )
        {
            // shift all the variables above this one
            Counter = 0;
            pIn = pCell->uTruth; pOut = uTemp;
            for ( i = k; i < (int)pCell->nVars - 1; i++ )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, pCell->nVars, i );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                // swap the support vars
                Temp = pCell->CanonPerm[i]; 
                pCell->CanonPerm[i] = pCell->CanonPerm[i+1];
                pCell->CanonPerm[i+1] = Temp;
                Counter++;
            }
            // return the function back into its place
            if ( Counter & 1 )
                Extra_TruthCopy( pOut, pIn, pCell->nVars );
            // remove one variable
            pCell->nVars--;
//            Extra_PrintBinary( stdout, pCell->uTruth, (1<<pCell->nVars) ); printf( "\n" );
        }
}